

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error cio_uart_set_flow_control(cio_uart *port,cio_uart_flow_control flow_control)

{
  cio_error cVar1;
  termios tty;
  
  if (port == (cio_uart *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  cVar1 = get_current_settings(port,&tty);
  if (cVar1 == CIO_SUCCESS) {
    if (flow_control == CIO_UART_FLOW_CONTROL_XON_XOFF) {
      tty.c_cflag._3_1_ = tty.c_cflag._3_1_ & 0x7f;
      tty.c_iflag._1_1_ = tty.c_iflag._1_1_ | 0x1c;
    }
    else if (flow_control == CIO_UART_FLOW_CONTROL_RTS_CTS) {
      tty.c_iflag._1_1_ = tty.c_iflag._1_1_ & 0xe3;
      tty.c_cflag._3_1_ = tty.c_cflag._3_1_ | 0x80;
    }
    else {
      if (flow_control != CIO_UART_FLOW_CONTROL_NONE) {
        return CIO_INVALID_ARGUMENT;
      }
      tty.c_cflag._3_1_ = tty.c_cflag._3_1_ & 0x7f;
      tty.c_iflag._1_1_ = tty.c_iflag._1_1_ & 0xe3;
    }
    cVar1 = set_termios((port->impl).ev.fd,&tty);
  }
  return cVar1;
}

Assistant:

enum cio_error cio_uart_set_flow_control(const struct cio_uart *port, enum cio_uart_flow_control flow_control)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (flow_control) {
	case CIO_UART_FLOW_CONTROL_NONE:
		tty.c_cflag &= ~(tcflag_t)CRTSCTS;
		tty.c_iflag &= ~((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		break;
	case CIO_UART_FLOW_CONTROL_RTS_CTS:
		tty.c_iflag &= ~((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		tty.c_cflag |= (tcflag_t)CRTSCTS;
		break;
	case CIO_UART_FLOW_CONTROL_XON_XOFF:
		tty.c_cflag &= ~(tcflag_t)CRTSCTS;
		tty.c_iflag |= ((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}